

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-emitter-test-suite.c
# Opt level: O0

int get_line(FILE *input,char *line)

{
  char *pcVar1;
  char *newline;
  char *line_local;
  FILE *input_local;
  
  pcVar1 = fgets(line,0x3ff,(FILE *)input);
  if (pcVar1 == (char *)0x0) {
    input_local._4_4_ = 0;
  }
  else {
    pcVar1 = strchr(line,10);
    if (pcVar1 == (char *)0x0) {
      fprintf(_stderr,"Line too long: \'%s\'",line);
      abort();
    }
    *pcVar1 = '\0';
    input_local._4_4_ = 1;
  }
  return input_local._4_4_;
}

Assistant:

int get_line(FILE * input, char *line)
{
    char *newline;

    if (!fgets(line, 1024 - 1, input))
        return 0;

    if ((newline = strchr(line, '\n')) == NULL) {
        fprintf(stderr, "Line too long: '%s'", line);
        abort();
    }
    *newline = '\0';

    return 1;
}